

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_set_var_test(void)

{
  long *plVar1;
  uint64_t uVar2;
  void *pvVar3;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var4;
  _func_void_btree_ptr_void_ptr_void_ptr *p_Var5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  bnode *pbVar10;
  size_t sVar11;
  ushort *puVar12;
  ushort *puVar13;
  undefined2 *puVar14;
  btree_kv_ops *pbVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  char *pcVar20;
  undefined8 *puVar21;
  long lVar22;
  ulong uVar23;
  bnode *__s2;
  char cVar24;
  long lVar25;
  char *pcVar26;
  void *key;
  timeval __test_begin;
  char acStack_6b7 [310];
  char acStack_581 [383];
  char acStack_402 [170];
  char acStack_358 [40];
  undefined8 uStack_330;
  char acStack_328 [48];
  btree_kv_ops bStack_2f8;
  timeval tStack_278;
  char *apcStack_268 [7];
  char *pcStack_230;
  char *pcStack_228;
  ulong uStack_220;
  bnode *pbStack_218;
  char *pcStack_210;
  undefined1 uStack_201;
  void *pvStack_200;
  char *pcStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  long lStack_1e0;
  code *pcStack_1d8;
  btree_kv_ops bStack_1d0;
  undefined8 uStack_158;
  undefined8 auStack_150 [6];
  timeval tStack_120;
  btree_kv_ops *pbStack_110;
  bnode *pbStack_108;
  char cStack_f9;
  bnode *pbStack_f8;
  undefined1 *puStack_f0;
  btree_kv_ops *pbStack_e8;
  char *pcStack_e0;
  uint64_t uStack_d8;
  long local_c8;
  undefined2 *local_c0;
  timeval local_b8;
  btree_kv_ops local_a8;
  
  gettimeofday(&local_b8,(__timezone_ptr_t)0x0);
  memleak_start();
  local_c0 = (undefined2 *)malloc(0xd);
  *local_c0 = 0xb00;
  *(undefined8 *)(local_c0 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)local_c0 + 9) = 0x676e69;
  local_c8 = 10;
  btree_str_kv_get_kb64_vb64(&local_a8);
  pbVar10 = (bnode *)malloc(0x1010);
  pbVar10->kvsize = 0;
  pbVar10->flag = 0;
  pbVar10->level = 0;
  pbVar10->nentry = 0;
  (pbVar10->field_4).data = (void *)0x0;
  pbVar10->kvsize = 0xd08;
  pbVar10->level = 1;
  (pbVar10->field_4).data = pbVar10 + 1;
  (*local_a8.set_kv)(pbVar10,0,&local_c0,&local_c8);
  uVar2 = (pbVar10->field_4).dummy;
  iVar7 = strcmp((char *)(uVar2 + 2),"teststring");
  if (iVar7 == 0) {
    if (*(long *)(uVar2 + 0xd) == local_c8) {
      kv_set_var_test();
      return;
    }
  }
  else {
    kv_set_var_test();
  }
  kv_set_var_test();
  pcStack_e0 = "teststring";
  lVar17 = 0;
  uStack_158 = 0x102f75;
  pbStack_f8 = pbVar10;
  puStack_f0 = (undefined1 *)&local_c8;
  pbStack_e8 = &local_a8;
  uStack_d8 = uVar2;
  gettimeofday(&tStack_120,(__timezone_ptr_t)0x0);
  uStack_158 = 0x102f7a;
  memleak_start();
  do {
    pcVar20 = *(char **)((long)&DAT_00109d70 + lVar17);
    uStack_158 = 0x102f8d;
    sVar11 = strlen(pcVar20);
    uVar8 = (int)sVar11 + 1;
    uVar23 = (ulong)(uVar8 & 0xffff);
    uStack_158 = 0x102f9c;
    puVar12 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar8;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    uStack_158 = 0x102fb9;
    memcpy(puVar12 + 1,pcVar20,uVar23);
    *(ushort **)((long)auStack_150 + lVar17) = puVar12;
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x30);
  uStack_158 = 0x102fd2;
  pbStack_108 = (bnode *)malloc(0x1010);
  pbStack_108->kvsize = 0;
  pbStack_108->flag = 0;
  pbStack_108->level = 0;
  pbStack_108->nentry = 0;
  (pbStack_108->field_4).data = (void *)0x0;
  pbStack_108->kvsize = 0x901;
  pbStack_108->level = 1;
  pbStack_108->nentry = 6;
  (pbStack_108->field_4).data = pbStack_108 + 1;
  cStack_f9 = 'd';
  pbStack_110 = &bStack_1d0;
  pcStack_1d8 = (code *)0x10300a;
  btree_str_kv_get_kb64_vb64(pbStack_110);
  lVar22 = 0;
  lVar17 = 0;
  lVar25 = 0;
  while( true ) {
    pbVar10 = pbStack_108;
    pcStack_1d8 = (code *)0x103031;
    (*pbStack_110->set_kv)
              (pbStack_108,(idx_t)lVar17,(void *)((long)auStack_150 + lVar22),&cStack_f9);
    pvVar3 = (pbVar10->field_4).data;
    pcVar20 = *(char **)((long)&DAT_00109d70 + lVar22);
    pcStack_1d8 = (code *)0x103050;
    iVar7 = strcmp((char *)((long)pvVar3 + lVar25 + 2),pcVar20);
    if (iVar7 != 0) break;
    pcStack_1d8 = (code *)0x10305c;
    sVar11 = strlen(pcVar20);
    if (*(char *)((long)pvVar3 + lVar25 + sVar11 + 3) != cStack_f9) {
      pcStack_1d8 = (code *)0x1030ae;
      kv_set_var_nentry_test();
      break;
    }
    lVar25 = lVar25 + sVar11 + 4;
    cStack_f9 = cStack_f9 + '\x01';
    lVar17 = lVar17 + 1;
    lVar22 = lVar22 + 8;
    if (lVar17 == 6) {
      pcStack_1d8 = (code *)0x10309a;
      kv_set_var_nentry_test();
      return;
    }
  }
  pcStack_1d8 = kv_set_var_nentry_update_test;
  kv_set_var_nentry_test();
  pcVar16 = acStack_328;
  uVar23 = 0;
  uStack_330 = 0x1030d8;
  pvStack_200 = pvVar3;
  pcStack_1f8 = pcVar20;
  lStack_1f0 = lVar17;
  lStack_1e8 = lVar22;
  lStack_1e0 = lVar25;
  pcStack_1d8 = (code *)&stack0xffffffffffffff30;
  gettimeofday(&tStack_278,(__timezone_ptr_t)0x0);
  uStack_330 = 0x1030dd;
  memleak_start();
  apcStack_268[0] = "string";
  apcStack_268[1] = "longstring";
  apcStack_268[4] = "123231234242423428492342";
  apcStack_268[5] = "string WITH space";
  apcStack_268[2] = "longerstring";
  apcStack_268[3] = "";
  pcStack_228 = "string";
  uStack_330 = 0x103111;
  sVar11 = strlen("string");
  uStack_330 = 0x10311e;
  pbStack_218 = (bnode *)malloc(0x1010);
  pbStack_218->kvsize = 0;
  pbStack_218->flag = 0;
  pbStack_218->level = 0;
  pbStack_218->nentry = 0;
  (pbStack_218->field_4).data = (void *)0x0;
  pbStack_218->kvsize = (short)((int)sVar11 << 8) + 0x301;
  pbStack_218->level = 1;
  pbStack_218->nentry = 6;
  (pbStack_218->field_4).data = pbStack_218 + 1;
  uStack_201 = 100;
  uStack_330 = 0x103159;
  btree_str_kv_get_kb64_vb64(&bStack_2f8);
  pbVar10 = (bnode *)0x0;
  pcVar20 = (char *)0x0;
  do {
    pcVar19 = *(char **)((long)apcStack_268 + uVar23);
    uStack_330 = 0x10316e;
    sVar11 = strlen(pcVar19);
    uVar8 = (int)sVar11 + 1;
    pcStack_210 = acStack_328 + uVar23;
    uVar18 = (ulong)(uVar8 & 0xffff);
    uStack_330 = 0x103190;
    uStack_220 = uVar23;
    puVar12 = (ushort *)malloc(uVar18 + 2);
    uVar6 = (ushort)uVar8;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    uStack_330 = 0x1031ad;
    memcpy(puVar12 + 1,pcVar19,uVar18);
    pcVar26 = pcStack_210;
    *(ushort **)pcStack_210 = puVar12;
    __s2 = pbStack_218;
    uStack_330 = 0x1031c8;
    (*bStack_2f8.set_kv)(pbStack_218,(idx_t)pbVar10,pcVar26,&uStack_201);
    uStack_330 = 0x1031dc;
    iVar7 = strcmp((char *)((long)(__s2->field_4).data + (long)pcVar20) + 2,pcVar19);
    if (iVar7 != 0) {
      uStack_330 = 0x1033e9;
      kv_set_var_nentry_update_test();
      goto LAB_001033e9;
    }
    uStack_330 = 0x1031ec;
    sVar11 = strlen(pcVar19);
    pcVar20 = pcVar20 + sVar11 + 4;
    pbVar10 = (bnode *)(ulong)((int)pbVar10 + 1);
    uVar23 = uStack_220 + 8;
  } while (uVar23 != 0x30);
  lVar17 = 0;
  do {
    uStack_330 = 0x103216;
    free(*(void **)(acStack_328 + lVar17 * 8));
    lVar17 = lVar17 + 1;
  } while (lVar17 != 6);
  pcVar16 = acStack_358;
  pcStack_210 = pcVar16;
  puVar12 = (ushort *)0x0;
  iVar7 = 0;
  __s2 = (bnode *)0x0;
  do {
    uStack_220 = CONCAT44(uStack_220._4_4_,iVar7);
    pcVar20 = *(char **)((long)apcStack_268 + (long)puVar12);
    sVar11 = strlen(pcVar20);
    uVar8 = (int)sVar11 + 1;
    pcStack_230 = pcStack_210 + (long)puVar12;
    uVar18 = (ulong)(uVar8 & 0xffff);
    puVar13 = (ushort *)malloc(uVar18 + 2);
    uVar23 = uStack_220;
    uVar6 = (ushort)uVar8;
    *puVar13 = uVar6 << 8 | uVar6 >> 8;
    iVar7 = (int)uStack_220;
    pcVar19 = (char *)(uStack_220 & 0xffffffff);
    memcpy(puVar13 + 1,pcVar20,uVar18);
    pbVar10 = pbStack_218;
    *(ushort **)(pcStack_210 + (long)puVar12) = puVar13;
    (*bStack_2f8.set_kv)(pbStack_218,(idx_t)uVar23,pcStack_230,&uStack_201);
    iVar9 = strcmp((char *)((long)(pbVar10->field_4).data + (long)__s2) + 2,pcVar20);
    if (iVar9 != 0) goto LAB_001033e9;
    sVar11 = strlen(pcVar20);
    pcVar20 = pcStack_210;
    pbVar10 = pbStack_218;
    __s2 = (bnode *)((long)&__s2->level + sVar11);
    iVar7 = iVar7 + 1;
    puVar12 = puVar12 + 4;
  } while (puVar12 != (ushort *)0x30);
  (*bStack_2f8.set_kv)(pbStack_218,3,pcStack_210,&uStack_201);
  pcVar19 = pcStack_228;
  apcStack_268[3] = pcStack_228;
  puVar12 = (ushort *)0x0;
  (*bStack_2f8.set_kv)(pbVar10,0,pcVar20 + 0x28,&uStack_201);
  apcStack_268[0] = apcStack_268[5];
  (*bStack_2f8.set_kv)(pbVar10,5,pcVar20,&uStack_201);
  apcStack_268[5] = pcVar19;
  pbVar10 = (bnode *)((pbVar10->field_4).dummy + 2);
  pcVar19 = (char *)0x0;
  while( true ) {
    __s2 = (bnode *)apcStack_268[(long)puVar12];
    iVar7 = strcmp(pcVar19 + (long)&pbVar10->kvsize,(char *)__s2);
    if (iVar7 != 0) break;
    sVar11 = strlen((char *)__s2);
    pcVar19 = pcVar19 + sVar11 + 4;
    puVar12 = (ushort *)((long)puVar12 + 1);
    if (puVar12 == (ushort *)0x6) {
      free(pbStack_218);
      lVar17 = 0;
      do {
        free(*(void **)(pcVar20 + lVar17 * 8));
        lVar17 = lVar17 + 1;
      } while (lVar17 != 6);
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (kv_set_var_nentry_update_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar20,"kv_set_var_nentry_update_test");
      return;
    }
  }
LAB_001033ee:
  *(code **)(pcVar16 + -8) = kv_get_var_test;
  kv_set_var_nentry_update_test();
  *(code ***)(pcVar16 + -8) = &pcStack_1d8;
  *(ushort **)(pcVar16 + -0x10) = puVar12;
  *(bnode **)(pcVar16 + -0x18) = __s2;
  *(char **)(pcVar16 + -0x20) = pcVar20;
  *(char **)(pcVar16 + -0x28) = pcVar19;
  *(bnode **)(pcVar16 + -0x30) = pbVar10;
  pcVar16[-0x80] = '\r';
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x40),(__timezone_ptr_t)0x0);
  pcVar16[-0x80] = '\x12';
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  memleak_start();
  pcVar16[-0x80] = '\x1c';
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  puVar14 = (undefined2 *)malloc(0xd);
  *puVar14 = 0xb00;
  *(undefined8 *)(puVar14 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar14 + 9) = 0x676e69;
  pcVar26 = "teststring";
  pcVar20 = pcVar16 + -0x60;
  *(undefined2 **)pcVar20 = puVar14;
  pcVar16[-0x80] = 'P';
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  pbVar10 = (bnode *)malloc(0x1010);
  pbVar10->kvsize = 0;
  pbVar10->flag = 0;
  pbVar10->level = 0;
  pbVar10->nentry = 0;
  (pbVar10->field_4).data = (void *)0x0;
  pbVar10->kvsize = 0xd08;
  pbVar10->level = 1;
  (pbVar10->field_4).data = pbVar10 + 1;
  pcVar19 = pcVar16 + -0x70;
  pcVar19[0] = '\x14';
  pcVar19[1] = '\0';
  pcVar19[2] = '\0';
  pcVar19[3] = '\0';
  pcVar19[4] = '\0';
  pcVar19[5] = '\0';
  pcVar19[6] = '\0';
  pcVar19[7] = '\0';
  plVar1 = (long *)(pcVar16 + -0x68);
  *plVar1 = 0;
  pcVar16[-0x80] = -0x73;
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  pbVar15 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var4 = pbVar15->set_kv;
  pcVar16[-0x80] = -0x62;
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  (*p_Var4)(pbVar10,0,pcVar20,pcVar19);
  p_Var4 = pbVar15->get_kv;
  pcVar16[-0x80] = -0x54;
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  (*p_Var4)(pbVar10,0,plVar1,pcVar16 + -0x78);
  pcVar16[-0x80] = -0x44;
  pcVar16[-0x7f] = '4';
  pcVar16[-0x7e] = '\x10';
  pcVar16[-0x7d] = '\0';
  pcVar16[-0x7c] = '\0';
  pcVar16[-0x7b] = '\0';
  pcVar16[-0x7a] = '\0';
  pcVar16[-0x79] = '\0';
  iVar7 = strcmp((char *)(*plVar1 + 2),"teststring");
  if (iVar7 == 0) {
    if (*(long *)(pcVar16 + -0x78) != *(long *)(pcVar16 + -0x70)) goto LAB_001035c7;
    pcVar26 = pcVar16 + -0x68;
    p_Var4 = pbVar15->get_kv;
    pcVar16[-0x80] = -0x1a;
    pcVar16[-0x7f] = '4';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    (*p_Var4)(pbVar10,0,pcVar26,pcVar16 + -0x78);
    pcVar16[-0x80] = -7;
    pcVar16[-0x7f] = '4';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    iVar7 = strcmp((char *)(*(long *)pcVar26 + 2),"teststring");
    if (iVar7 != 0) goto LAB_001035cc;
    if (*(long *)(pcVar16 + -0x78) != *(long *)(pcVar16 + -0x70)) goto LAB_001035d1;
    p_Var4 = pbVar15->get_kv;
    builtin_strncpy(pcVar16 + -0x80,"\"5\x10",4);
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    (*p_Var4)(pbVar10,0,pcVar16 + -0x68,(void *)0x0);
    pcVar26 = *(char **)(pcVar16 + -0x68);
    builtin_strncpy(pcVar16 + -0x80,"55\x10",4);
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    iVar7 = strcmp((char *)((long)pcVar26 + 2),"teststring");
    if (iVar7 != 0) goto LAB_001035d6;
    if (*(long *)(pcVar16 + -0x78) == *(long *)(pcVar16 + -0x70)) {
      pcVar16[-0x80] = 'T';
      pcVar16[-0x7f] = '5';
      pcVar16[-0x7e] = '\x10';
      pcVar16[-0x7d] = '\0';
      pcVar16[-0x7c] = '\0';
      pcVar16[-0x7b] = '\0';
      pcVar16[-0x7a] = '\0';
      pcVar16[-0x79] = '\0';
      free(pbVar10);
      *(btree_kv_ops **)(pcVar16 + -0x58) = pbVar15;
      *(undefined8 *)(pcVar16 + -0x50) = *(undefined8 *)(pcVar16 + -0x60);
      *(char **)(pcVar16 + -0x48) = pcVar26;
      lVar17 = 0;
      do {
        pvVar3 = *(void **)(pcVar16 + lVar17 * 8 + -0x58);
        builtin_strncpy(pcVar16 + -0x80,"t5\x10",4);
        pcVar16[-0x7c] = '\0';
        pcVar16[-0x7b] = '\0';
        pcVar16[-0x7a] = '\0';
        pcVar16[-0x79] = '\0';
        free(pvVar3);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      pcVar16[-0x80] = -0x7e;
      pcVar16[-0x7f] = '5';
      pcVar16[-0x7e] = '\x10';
      pcVar16[-0x7d] = '\0';
      pcVar16[-0x7c] = '\0';
      pcVar16[-0x7b] = '\0';
      pcVar16[-0x7a] = '\0';
      pcVar16[-0x79] = '\0';
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (kv_get_var_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcVar16[-0x80] = -0x4d;
      pcVar16[-0x7f] = '5';
      pcVar16[-0x7e] = '\x10';
      pcVar16[-0x7d] = '\0';
      pcVar16[-0x7c] = '\0';
      pcVar16[-0x7b] = '\0';
      pcVar16[-0x7a] = '\0';
      pcVar16[-0x79] = '\0';
      fprintf(_stderr,pcVar20,"kv_get_var_test");
      return;
    }
  }
  else {
    pcVar16[-0x80] = -0x39;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
LAB_001035c7:
    pcVar16[-0x80] = -0x34;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
LAB_001035cc:
    pcVar16[-0x80] = -0x2f;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
LAB_001035d1:
    pcVar16[-0x80] = -0x2a;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
LAB_001035d6:
    pcVar16[-0x80] = -0x25;
    pcVar16[-0x7f] = '5';
    pcVar16[-0x7e] = '\x10';
    pcVar16[-0x7d] = '\0';
    pcVar16[-0x7c] = '\0';
    pcVar16[-0x7b] = '\0';
    pcVar16[-0x7a] = '\0';
    pcVar16[-0x79] = '\0';
    kv_get_var_test();
  }
  *(code **)(pcVar16 + -0x80) = kv_get_var_nentry_test;
  kv_get_var_test();
  *(long **)(pcVar16 + -0x80) = plVar1;
  *(char **)(pcVar16 + -0x88) = pcVar26;
  *(btree_kv_ops **)(pcVar16 + -0x90) = pbVar15;
  *(char **)(pcVar16 + -0x98) = pcVar19;
  *(char **)(pcVar16 + -0xa0) = pcVar20;
  *(bnode **)(pcVar16 + -0xa8) = pbVar10;
  lVar17 = 0;
  pcVar16[-0x118] = '\x02';
  pcVar16[-0x117] = '6';
  pcVar16[-0x116] = '\x10';
  pcVar16[-0x115] = '\0';
  pcVar16[-0x114] = '\0';
  pcVar16[-0x113] = '\0';
  pcVar16[-0x112] = '\0';
  pcVar16[-0x111] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x110),(__timezone_ptr_t)0x0);
  pcVar16[-0x118] = '\a';
  pcVar16[-0x117] = '6';
  pcVar16[-0x116] = '\x10';
  pcVar16[-0x115] = '\0';
  pcVar16[-0x114] = '\0';
  pcVar16[-0x113] = '\0';
  pcVar16[-0x112] = '\0';
  pcVar16[-0x111] = '\0';
  memleak_start();
  pcVar16[-0xb8] = '\0';
  pcVar16[-0xb7] = '\0';
  pcVar16[-0xb6] = '\0';
  pcVar16[-0xb5] = '\0';
  pcVar16[-0xb4] = '\0';
  pcVar16[-0xb3] = '\0';
  pcVar16[-0xb2] = '\0';
  pcVar16[-0xb1] = '\0';
  puVar21 = &DAT_00109d70;
  do {
    pcVar20 = *(char **)((long)&DAT_00109d70 + lVar17);
    builtin_strncpy(pcVar16 + -0x118,"\"6\x10",4);
    pcVar16[-0x114] = '\0';
    pcVar16[-0x113] = '\0';
    pcVar16[-0x112] = '\0';
    pcVar16[-0x111] = '\0';
    sVar11 = strlen(pcVar20);
    uVar8 = (int)sVar11 + 1;
    uVar23 = (ulong)(uVar8 & 0xffff);
    builtin_strncpy(pcVar16 + -0x118,"16\x10",4);
    pcVar16[-0x114] = '\0';
    pcVar16[-0x113] = '\0';
    pcVar16[-0x112] = '\0';
    pcVar16[-0x111] = '\0';
    puVar12 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar8;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    builtin_strncpy(pcVar16 + -0x118,"N6\x10",4);
    pcVar16[-0x114] = '\0';
    pcVar16[-0x113] = '\0';
    pcVar16[-0x112] = '\0';
    pcVar16[-0x111] = '\0';
    memcpy(puVar12 + 1,pcVar20,uVar23);
    *(ushort **)(pcVar16 + lVar17 + -0x100) = puVar12;
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x30);
  pcVar16[-0x118] = 'g';
  pcVar16[-0x117] = '6';
  pcVar16[-0x116] = '\x10';
  pcVar16[-0x115] = '\0';
  pcVar16[-0x114] = '\0';
  pcVar16[-0x113] = '\0';
  pcVar16[-0x112] = '\0';
  pcVar16[-0x111] = '\0';
  pbVar10 = (bnode *)malloc(0x1010);
  pbVar10->kvsize = 0;
  pbVar10->flag = 0;
  pbVar10->level = 0;
  pbVar10->nentry = 0;
  (pbVar10->field_4).data = (void *)0x0;
  pbVar10->kvsize = 0x901;
  pbVar10->level = 1;
  pbVar10->nentry = 6;
  (pbVar10->field_4).data = pbVar10 + 1;
  pcVar16[-0xa9] = 'd';
  pbVar15 = (btree_kv_ops *)(pcVar16 + -400);
  pcVar16[-0x198] = -99;
  pcVar16[-0x197] = '6';
  pcVar16[-0x196] = '\x10';
  pcVar16[-0x195] = '\0';
  pcVar16[-0x194] = '\0';
  pcVar16[-0x193] = '\0';
  pcVar16[-0x192] = '\0';
  pcVar16[-0x191] = '\0';
  btree_str_kv_get_kb64_vb64(pbVar15);
  pcVar20 = pcVar16 + -0x100;
  uVar23 = 0;
  do {
    pcVar16[-0x198] = -0x4a;
    pcVar16[-0x197] = '6';
    pcVar16[-0x196] = '\x10';
    pcVar16[-0x195] = '\0';
    pcVar16[-0x194] = '\0';
    pcVar16[-0x193] = '\0';
    pcVar16[-0x192] = '\0';
    pcVar16[-0x191] = '\0';
    (**(code **)(pcVar16 + -0x188))(pbVar10,uVar23 & 0xffff,pcVar20,pcVar16 + -0xa9);
    pcVar16[-0xa9] = pcVar16[-0xa9] + '\x01';
    uVar23 = uVar23 + 1;
    pcVar20 = pcVar20 + 8;
  } while (uVar23 != 6);
  pcVar16[-0xa9] = 'd';
  lVar17 = 0;
  while( true ) {
    p_Var4 = pbVar15->get_kv;
    pcVar16[-0x198] = -0x1e;
    pcVar16[-0x197] = '6';
    pcVar16[-0x196] = '\x10';
    pcVar16[-0x195] = '\0';
    pcVar16[-0x194] = '\0';
    pcVar16[-0x193] = '\0';
    pcVar16[-0x192] = '\0';
    pcVar16[-0x191] = '\0';
    (*p_Var4)(pbVar10,(idx_t)lVar17,pcVar16 + -0xb8,pcVar16 + -0xaa);
    pcVar20 = (char *)*puVar21;
    pcVar16[-0x198] = -0xd;
    pcVar16[-0x197] = '6';
    pcVar16[-0x196] = '\x10';
    pcVar16[-0x195] = '\0';
    pcVar16[-0x194] = '\0';
    pcVar16[-0x193] = '\0';
    pcVar16[-0x192] = '\0';
    pcVar16[-0x191] = '\0';
    iVar7 = strcmp((char *)(*(long *)(pcVar16 + -0xb8) + 2),pcVar20);
    if (iVar7 != 0) break;
    if (pcVar16[-0xaa] != pcVar16[-0xa9]) {
      pcVar16[-0x198] = -0x67;
      pcVar16[-0x197] = '7';
      pcVar16[-0x196] = '\x10';
      pcVar16[-0x195] = '\0';
      pcVar16[-0x194] = '\0';
      pcVar16[-0x193] = '\0';
      pcVar16[-0x192] = '\0';
      pcVar16[-0x191] = '\0';
      kv_get_var_nentry_test();
      break;
    }
    pcVar16[-0xa9] = pcVar16[-0xa9] + '\x01';
    lVar17 = lVar17 + 1;
    puVar21 = puVar21 + 1;
    if (lVar17 == 6) {
      *(bnode **)(pcVar16 + -0xd0) = pbVar10;
      *(undefined8 *)(pcVar16 + -200) = *(undefined8 *)(pcVar16 + -0xb8);
      lVar17 = 0;
      do {
        pvVar3 = *(void **)(pcVar16 + lVar17 * 8 + -0xd0);
        builtin_strncpy(pcVar16 + -0x198,"17\x10",4);
        pcVar16[-0x194] = '\0';
        pcVar16[-0x193] = '\0';
        pcVar16[-0x192] = '\0';
        pcVar16[-0x191] = '\0';
        free(pvVar3);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 2);
      lVar17 = 0;
      do {
        pvVar3 = *(void **)(pcVar16 + lVar17 * 8 + -0x100);
        builtin_strncpy(pcVar16 + -0x198,"F7\x10",4);
        pcVar16[-0x194] = '\0';
        pcVar16[-0x193] = '\0';
        pcVar16[-0x192] = '\0';
        pcVar16[-0x191] = '\0';
        free(pvVar3);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 6);
      builtin_strncpy(pcVar16 + -0x198,"T7\x10",4);
      pcVar16[-0x194] = '\0';
      pcVar16[-0x193] = '\0';
      pcVar16[-0x192] = '\0';
      pcVar16[-0x191] = '\0';
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (kv_get_var_nentry_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcVar16[-0x198] = -0x7b;
      pcVar16[-0x197] = '7';
      pcVar16[-0x196] = '\x10';
      pcVar16[-0x195] = '\0';
      pcVar16[-0x194] = '\0';
      pcVar16[-0x193] = '\0';
      pcVar16[-0x192] = '\0';
      pcVar16[-0x191] = '\0';
      fprintf(_stderr,pcVar20,"kv_get_var_nentry_test");
      return;
    }
  }
  *(code **)(pcVar16 + -0x198) = kv_ins_var;
  kv_get_var_nentry_test();
  *(char **)(pcVar16 + -0x198) = pcVar16 + -0x80;
  *(long *)(pcVar16 + -0x1a0) = lVar17;
  *(btree_kv_ops **)(pcVar16 + -0x1a8) = pbVar15;
  *(undefined8 **)(pcVar16 + -0x1b0) = puVar21;
  *(char **)(pcVar16 + -0x1b8) = pcVar16 + -0xaa;
  *(bnode **)(pcVar16 + -0x1c0) = pbVar10;
  pcVar16[-0x200] = -0x48;
  pcVar16[-0x1ff] = '7';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x1d0),(__timezone_ptr_t)0x0);
  pcVar16[-0x200] = -0x43;
  pcVar16[-0x1ff] = '7';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  memleak_start();
  pcVar16[-0x200] = -0x39;
  pcVar16[-0x1ff] = '7';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  puVar14 = (undefined2 *)malloc(0xd);
  *puVar14 = 0xb00;
  *(undefined8 *)(puVar14 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar14 + 9) = 0x676e69;
  pcVar20 = pcVar16 + -0x1d8;
  *(undefined2 **)pcVar20 = puVar14;
  pcVar16[-0x200] = -5;
  pcVar16[-0x1ff] = '7';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  pbVar10 = (bnode *)malloc(0x1010);
  pbVar10->kvsize = 0;
  pbVar10->flag = 0;
  pbVar10->level = 0;
  pbVar10->nentry = 0;
  (pbVar10->field_4).data = (void *)0x0;
  pbVar10->kvsize = 0xd08;
  pbVar10->level = 1;
  (pbVar10->field_4).data = pbVar10 + 1;
  pcVar19 = pcVar16 + -0x1e8;
  pcVar19[0] = '\x14';
  pcVar19[1] = '\0';
  pcVar19[2] = '\0';
  pcVar19[3] = '\0';
  pcVar19[4] = '\0';
  pcVar19[5] = '\0';
  pcVar19[6] = '\0';
  pcVar19[7] = '\0';
  plVar1 = (long *)(pcVar16 + -0x1e0);
  *plVar1 = 0;
  pcVar16[-0x200] = '8';
  pcVar16[-0x1ff] = '8';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  pbVar15 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var4 = pbVar15->ins_kv;
  pcVar16[-0x200] = 'I';
  pcVar16[-0x1ff] = '8';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  (*p_Var4)(pbVar10,0,pcVar20,pcVar19);
  p_Var4 = pbVar15->get_kv;
  pcVar16[-0x200] = 'Y';
  pcVar16[-0x1ff] = '8';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  (*p_Var4)(pbVar10,0,plVar1,pcVar16 + -0x1f0);
  pcVar16[-0x200] = 'i';
  pcVar16[-0x1ff] = '8';
  pcVar16[-0x1fe] = '\x10';
  pcVar16[-0x1fd] = '\0';
  pcVar16[-0x1fc] = '\0';
  pcVar16[-0x1fb] = '\0';
  pcVar16[-0x1fa] = '\0';
  pcVar16[-0x1f9] = '\0';
  iVar7 = strcmp((char *)(*plVar1 + 2),"teststring");
  if (iVar7 == 0) {
    if (*(long *)(pcVar16 + -0x1f0) == *(long *)(pcVar16 + -0x1e8)) {
      pcVar16[-0x200] = -0x7f;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      free(pbVar10);
      pcVar16[-0x200] = -0x77;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      free(pbVar15);
      pcVar16[-0x200] = -0x6d;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      free(*(void **)(pcVar16 + -0x1d8));
      pcVar16[-0x200] = -99;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      free(*(void **)(pcVar16 + -0x1e0));
      pcVar16[-0x200] = -0x5e;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (kv_ins_var()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcVar16[-0x200] = -0x2d;
      pcVar16[-0x1ff] = '8';
      pcVar16[-0x1fe] = '\x10';
      pcVar16[-0x1fd] = '\0';
      pcVar16[-0x1fc] = '\0';
      pcVar16[-0x1fb] = '\0';
      pcVar16[-0x1fa] = '\0';
      pcVar16[-0x1f9] = '\0';
      fprintf(_stderr,pcVar20,"kv_ins_var");
      return;
    }
  }
  else {
    pcVar16[-0x200] = -0x19;
    pcVar16[-0x1ff] = '8';
    pcVar16[-0x1fe] = '\x10';
    pcVar16[-0x1fd] = '\0';
    pcVar16[-0x1fc] = '\0';
    pcVar16[-0x1fb] = '\0';
    pcVar16[-0x1fa] = '\0';
    pcVar16[-0x1f9] = '\0';
    kv_ins_var();
  }
  *(code **)(pcVar16 + -0x200) = kv_ins_var_nentry_test;
  kv_ins_var();
  *(long **)(pcVar16 + -0x200) = plVar1;
  *(btree_kv_ops **)(pcVar16 + -0x208) = pbVar15;
  *(char **)(pcVar16 + -0x210) = "teststring";
  *(char **)(pcVar16 + -0x218) = pcVar19;
  *(char **)(pcVar16 + -0x220) = pcVar20;
  *(bnode **)(pcVar16 + -0x228) = pbVar10;
  pcVar20 = pcVar16 + -0x250;
  lVar17 = 0;
  pcVar16[-600] = '\v';
  pcVar16[-599] = '9';
  pcVar16[-0x256] = '\x10';
  pcVar16[-0x255] = '\0';
  pcVar16[-0x254] = '\0';
  pcVar16[-0x253] = '\0';
  pcVar16[-0x252] = '\0';
  pcVar16[-0x251] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x250),(__timezone_ptr_t)0x0);
  pcVar16[-600] = '\x10';
  pcVar16[-599] = '9';
  pcVar16[-0x256] = '\x10';
  pcVar16[-0x255] = '\0';
  pcVar16[-0x254] = '\0';
  pcVar16[-0x253] = '\0';
  pcVar16[-0x252] = '\0';
  pcVar16[-0x251] = '\0';
  memleak_start();
  do {
    pcVar19 = *(char **)((long)&DAT_00109d60 + lVar17);
    builtin_strncpy(pcVar16 + -600,"#9\x10",4);
    pcVar16[-0x254] = '\0';
    pcVar16[-0x253] = '\0';
    pcVar16[-0x252] = '\0';
    pcVar16[-0x251] = '\0';
    sVar11 = strlen(pcVar19);
    uVar8 = (int)sVar11 + 1;
    uVar23 = (ulong)(uVar8 & 0xffff);
    builtin_strncpy(pcVar16 + -600,"29\x10",4);
    pcVar16[-0x254] = '\0';
    pcVar16[-0x253] = '\0';
    pcVar16[-0x252] = '\0';
    pcVar16[-0x251] = '\0';
    puVar12 = (ushort *)malloc(uVar23 + 2);
    uVar6 = (ushort)uVar8;
    *puVar12 = uVar6 << 8 | uVar6 >> 8;
    builtin_strncpy(pcVar16 + -600,"O9\x10",4);
    pcVar16[-0x254] = '\0';
    pcVar16[-0x253] = '\0';
    pcVar16[-0x252] = '\0';
    pcVar16[-0x251] = '\0';
    memcpy(puVar12 + 1,pcVar19,uVar23);
    *(ushort **)(pcVar16 + lVar17 + -0x240) = puVar12;
    lVar17 = lVar17 + 8;
  } while (lVar17 == 8);
  pcVar16[-600] = 'h';
  pcVar16[-599] = '9';
  pcVar16[-0x256] = '\x10';
  pcVar16[-0x255] = '\0';
  pcVar16[-0x254] = '\0';
  pcVar16[-0x253] = '\0';
  pcVar16[-0x252] = '\0';
  pcVar16[-0x251] = '\0';
  puVar21 = (undefined8 *)malloc(0x1010);
  *puVar21 = 0;
  puVar21[1] = 0;
  *(undefined2 *)puVar21 = 0x901;
  *(undefined4 *)((long)puVar21 + 4) = 0x20001;
  puVar21[1] = puVar21 + 2;
  pcVar19 = pcVar16 + -0x229;
  *pcVar19 = 'd';
  pcVar16[-0x2d8] = -100;
  pcVar16[-0x2d7] = '9';
  pcVar16[-0x2d6] = '\x10';
  pcVar16[-0x2d5] = '\0';
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  btree_str_kv_get_kb64_vb64((btree_kv_ops *)(pcVar16 + -0x2d0));
  pcVar16[-0x2d8] = -0x54;
  pcVar16[-0x2d7] = '9';
  pcVar16[-0x2d6] = '\x10';
  pcVar16[-0x2d5] = '\0';
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  (**(code **)(pcVar16 + -0x2c0))(puVar21,0,pcVar16 + -0x240,pcVar19);
  *pcVar19 = *pcVar19 + '\x01';
  pcVar16[-0x2d8] = -0x41;
  pcVar16[-0x2d7] = '9';
  pcVar16[-0x2d6] = '\x10';
  pcVar16[-0x2d5] = '\0';
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  (**(code **)(pcVar16 + -0x2c0))(puVar21,0,pcVar16 + -0x238,pcVar19);
  lVar22 = puVar21[1];
  pcVar16[-0x2d8] = -0x2d;
  pcVar16[-0x2d7] = '9';
  pcVar16[-0x2d6] = '\x10';
  pcVar16[-0x2d5] = '\0';
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  iVar7 = strcmp((char *)(lVar22 + 2),"longstring");
  if (iVar7 == 0) {
    cVar24 = pcVar16[-0x229];
    pcVar20 = (char *)CONCAT71((int7)((ulong)(pcVar16 + -0x250) >> 8),cVar24);
    if (*(char *)(lVar22 + 0xd) != cVar24) goto LAB_00103a2a;
    cVar24 = cVar24 + -1;
    pcVar20 = (char *)CONCAT71((int7)((ulong)(pcVar16 + -0x250) >> 8),cVar24);
    pcVar16[-0x229] = cVar24;
    pcVar16[-0x2d8] = -8;
    pcVar16[-0x2d7] = '9';
    pcVar16[-0x2d6] = '\x10';
    pcVar16[-0x2d5] = '\0';
    pcVar16[-0x2d4] = '\0';
    pcVar16[-0x2d3] = '\0';
    pcVar16[-0x2d2] = '\0';
    pcVar16[-0x2d1] = '\0';
    iVar7 = strcmp((char *)(lVar22 + 0x10),"string");
    if (iVar7 == 0) {
      if (*(char *)(lVar22 + 0x17) == cVar24) {
        builtin_strncpy(pcVar16 + -0x2d8,"\x16:\x10",4);
        pcVar16[-0x2d4] = '\0';
        pcVar16[-0x2d3] = '\0';
        pcVar16[-0x2d2] = '\0';
        pcVar16[-0x2d1] = '\0';
        kv_ins_var_nentry_test();
        return;
      }
      goto LAB_00103a34;
    }
  }
  else {
    builtin_strncpy(pcVar16 + -0x2d8,"*:\x10",4);
    pcVar16[-0x2d4] = '\0';
    pcVar16[-0x2d3] = '\0';
    pcVar16[-0x2d2] = '\0';
    pcVar16[-0x2d1] = '\0';
    kv_ins_var_nentry_test();
LAB_00103a2a:
    builtin_strncpy(pcVar16 + -0x2d8,"/:\x10",4);
    pcVar16[-0x2d4] = '\0';
    pcVar16[-0x2d3] = '\0';
    pcVar16[-0x2d2] = '\0';
    pcVar16[-0x2d1] = '\0';
    kv_ins_var_nentry_test();
  }
  builtin_strncpy(pcVar16 + -0x2d8,"4:\x10",4);
  pcVar16[-0x2d4] = '\0';
  pcVar16[-0x2d3] = '\0';
  pcVar16[-0x2d2] = '\0';
  pcVar16[-0x2d1] = '\0';
  kv_ins_var_nentry_test();
LAB_00103a34:
  *(code **)(pcVar16 + -0x2d8) = kv_set_str_key_test;
  kv_ins_var_nentry_test();
  *(char **)(pcVar16 + -0x2d8) = pcVar20;
  *(long *)(pcVar16 + -0x2e0) = lVar22;
  *(undefined8 **)(pcVar16 + -0x2e8) = puVar21;
  pcVar16[-0x310] = 'N';
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x2f8),(__timezone_ptr_t)0x0);
  pcVar16[-0x310] = 'S';
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  memleak_start();
  pcVar16[-0x308] = '\0';
  pcVar16[-0x307] = '\0';
  pcVar16[-0x306] = '\0';
  pcVar16[-0x305] = '\0';
  pcVar16[-0x304] = '\0';
  pcVar16[-0x303] = '\0';
  pcVar16[-0x302] = '\0';
  pcVar16[-0x301] = '\0';
  pcVar16[-0x310] = 'd';
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  pbVar15 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  pcVar16[-0x310] = 'q';
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  puVar14 = (undefined2 *)malloc(0xd);
  *puVar14 = 0xb00;
  *(undefined8 *)(puVar14 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puVar14 + 9) = 0x676e69;
  pcVar20 = "teststring";
  *(undefined2 **)(pcVar16 + -0x300) = puVar14;
  p_Var5 = pbVar15->set_key;
  pcVar16[-0x310] = -0x5e;
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  (*p_Var5)((btree *)0x0,pcVar16 + -0x308,pcVar16 + -0x300);
  pcVar19 = *(char **)(pcVar16 + -0x308);
  pcVar16[-0x310] = -0x4f;
  pcVar16[-0x30f] = ':';
  pcVar16[-0x30e] = '\x10';
  pcVar16[-0x30d] = '\0';
  pcVar16[-0x30c] = '\0';
  pcVar16[-0x30b] = '\0';
  pcVar16[-0x30a] = '\0';
  pcVar16[-0x309] = '\0';
  iVar7 = strcmp(pcVar19 + 2,"teststring");
  if (iVar7 == 0) {
    pcVar16[-0x310] = -0x43;
    pcVar16[-0x30f] = ':';
    pcVar16[-0x30e] = '\x10';
    pcVar16[-0x30d] = '\0';
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    free(pcVar19);
    pcVar16[-0x310] = -0x39;
    pcVar16[-0x30f] = ':';
    pcVar16[-0x30e] = '\x10';
    pcVar16[-0x30d] = '\0';
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    puVar14 = (undefined2 *)malloc(0x15);
    *puVar14 = 0x1300;
    pcVar20 = (char *)(puVar14 + 1);
    pcVar20[0] = 'u';
    pcVar20[1] = 'p';
    pcVar20[2] = 'd';
    pcVar20[3] = 'a';
    pcVar20[4] = 't';
    pcVar20[5] = 'e';
    pcVar20[6] = 'd';
    pcVar20[7] = ' ';
    pcVar20 = (char *)(puVar14 + 5);
    pcVar20[0] = 't';
    pcVar20[1] = 'e';
    pcVar20[2] = 's';
    pcVar20[3] = 't';
    pcVar20[4] = 's';
    pcVar20[5] = 't';
    pcVar20[6] = 'r';
    pcVar20[7] = 'i';
    *(undefined4 *)((long)puVar14 + 0x11) = 0x676e69;
    pcVar19 = "updated teststring";
    *(undefined2 **)(pcVar16 + -0x308) = puVar14;
    pcVar20 = pcVar16 + -0x300;
    p_Var5 = pbVar15->set_key;
    pcVar16[-0x310] = -8;
    pcVar16[-0x30f] = ':';
    pcVar16[-0x30e] = '\x10';
    pcVar16[-0x30d] = '\0';
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    (*p_Var5)((btree *)0x0,pcVar20,pcVar16 + -0x308);
    pcVar16[-0x310] = '\a';
    pcVar16[-0x30f] = ';';
    pcVar16[-0x30e] = '\x10';
    pcVar16[-0x30d] = '\0';
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    iVar7 = strcmp((char *)(*(long *)pcVar20 + 2),"updated teststring");
    if (iVar7 == 0) {
      builtin_strncpy(pcVar16 + -0x310," ;\x10",4);
      pcVar16[-0x30c] = '\0';
      pcVar16[-0x30b] = '\0';
      pcVar16[-0x30a] = '\0';
      pcVar16[-0x309] = '\0';
      kv_set_str_key_test();
      return;
    }
  }
  else {
    builtin_strncpy(pcVar16 + -0x310,"/;\x10",4);
    pcVar16[-0x30c] = '\0';
    pcVar16[-0x30b] = '\0';
    pcVar16[-0x30a] = '\0';
    pcVar16[-0x309] = '\0';
    kv_set_str_key_test();
  }
  *(code **)(pcVar16 + -0x310) = kv_set_str_value_test;
  kv_set_str_key_test();
  *(char **)(pcVar16 + -0x310) = pcVar20;
  *(char **)(pcVar16 + -0x318) = pcVar19;
  *(long *)(pcVar16 + -800) = lVar17;
  *(btree_kv_ops **)(pcVar16 + -0x328) = pbVar15;
  pcVar16[-0x388] = 'K';
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  gettimeofday((timeval *)(pcVar16 + -0x370),(__timezone_ptr_t)0x0);
  pcVar16[-0x388] = 'P';
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  memleak_start();
  pcVar16[-0x380] = 'd';
  pcVar16[-0x37f] = '\0';
  pcVar16[-0x37e] = '\0';
  pcVar16[-0x37d] = '\0';
  pcVar16[-0x37c] = '\0';
  pcVar16[-0x37b] = '\0';
  pcVar16[-0x37a] = '\0';
  pcVar16[-0x379] = '\0';
  pcVar16[-0x35f] = '\b';
  pcVar16[-0x388] = 'k';
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  pbVar15 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  p_Var5 = pbVar15->set_value;
  pcVar16[-0x388] = '\x7f';
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  (*p_Var5)((btree *)(pcVar16 + -0x360),pcVar16 + -0x380,pcVar16 + -0x378);
  if (*(long *)(pcVar16 + -0x380) != *(long *)(pcVar16 + -0x378)) {
    pcVar16[-0x388] = -0x6b;
    pcVar16[-0x387] = ';';
    pcVar16[-0x386] = '\x10';
    pcVar16[-0x385] = '\0';
    pcVar16[-900] = '\0';
    pcVar16[-899] = '\0';
    pcVar16[-0x382] = '\0';
    pcVar16[-0x381] = '\0';
    kv_set_str_value_test();
  }
  plVar1 = (long *)(pcVar16 + -0x378);
  *plVar1 = 200;
  p_Var5 = pbVar15->set_value;
  pcVar16[-0x388] = -0x4e;
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  (*p_Var5)((btree *)(pcVar16 + -0x360),plVar1,pcVar16 + -0x380);
  if (*(long *)(pcVar16 + -0x380) != *plVar1) {
    pcVar16[-0x388] = -0x39;
    pcVar16[-0x387] = ';';
    pcVar16[-0x386] = '\x10';
    pcVar16[-0x385] = '\0';
    pcVar16[-900] = '\0';
    pcVar16[-899] = '\0';
    pcVar16[-0x382] = '\0';
    pcVar16[-0x381] = '\0';
    kv_set_str_value_test();
  }
  pcVar16[-0x388] = -0x31;
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  free(pbVar15);
  pcVar16[-0x388] = -0x2c;
  pcVar16[-0x387] = ';';
  pcVar16[-0x386] = '\x10';
  pcVar16[-0x385] = '\0';
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  memleak_end();
  pcVar20 = "%s PASSED\n";
  if (kv_set_str_value_test()::__test_pass != '\0') {
    pcVar20 = "%s FAILED\n";
  }
  builtin_strncpy(pcVar16 + -0x388,"\x05<\x10",4);
  pcVar16[-900] = '\0';
  pcVar16[-899] = '\0';
  pcVar16[-0x382] = '\0';
  pcVar16[-0x381] = '\0';
  fprintf(_stderr,pcVar20,"kv_set_str_value_test");
  return;
LAB_001033e9:
  pcVar16[-8] = -0x12;
  pcVar16[-7] = '3';
  pcVar16[-6] = '\x10';
  pcVar16[-5] = '\0';
  pcVar16[-4] = '\0';
  pcVar16[-3] = '\0';
  pcVar16[-2] = '\0';
  pcVar16[-1] = '\0';
  kv_set_var_nentry_update_test();
  goto LAB_001033ee;
}

Assistant:

void kv_set_var_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    void *key, *value;
    uint8_t ksize, vsize;
    int level;
    uint64_t v;
    int cmp;
    idx_t idx;
    char str[] = "teststring";
    key_len_t str_len = sizeof(str);

    vsize = sizeof(v);
    v = 10;

    construct_key_ptr(str, str_len, &key);
    value = alca(uint8_t, vsize);
    memset(value, 0, vsize);
    memcpy(value, &v, vsize);

    // init ops
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set key/value in node
    idx = 0;
    level = 1;
    ksize = str_len + sizeof(key_len_t);
    node = dummy_node(ksize, vsize, level);
    kv_ops->set_kv(node, idx, &key, value);

    // verify node->data
    cmp = strcmp((char *)((uint8_t *)node->data + sizeof(key_len_t)), str);
    TEST_CHK(cmp == 0);
    cmp = memcmp((uint8_t *)node->data + ksize, value, vsize);
    TEST_CHK(cmp == 0);

    void *vars[] = {node, key};
    freevars(vars, sizeof(vars)/sizeof(void *));

    memleak_end();
    TEST_RESULT("kv set var test");
}